

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O2

insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
__thiscall
glu::(anonymous_namespace)::
namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
          (_anonymous_namespace_ *this,Functions *gl,deUint32 program,VertexArrayBinding *first,
          VertexArrayBinding *end,
          insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
          out)

{
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *in_RAX;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  *piVar1;
  undefined4 in_register_00000014;
  _Iter _Var2;
  undefined8 extraout_RDX;
  value_type *__value;
  undefined1 auVar3 [16];
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  iVar4;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  int local_98;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  local_90;
  undefined1 local_80 [48];
  VertexArrayPointer local_50;
  
  _Var2._M_current = (VertexArrayBinding *)CONCAT44(in_register_00000014,program);
  local_90.container =
       (vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)end;
  for (__value = _Var2._M_current; __value != first; __value = __value + 1) {
    if ((__value->binding).type == TYPE_NAME) {
      auVar3 = (**(code **)(this + 0x780))
                         ((ulong)gl & 0xffffffff,(__value->binding).name._M_dataplus._M_p);
      if (-1 < auVar3._0_4_) {
        local_98 = auVar3._0_4_ + (__value->binding).location;
        local_c0._0_4_ = TYPE_LOCATION;
        local_b8._M_p = (pointer)&local_a8;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        BindingPoint::BindingPoint((BindingPoint *)local_80,(BindingPoint *)local_c0);
        local_50.componentType = (__value->pointer).componentType;
        local_50.convert = (__value->pointer).convert;
        local_50.numComponents = (__value->pointer).numComponents;
        local_50.numElements = (__value->pointer).numElements;
        local_50.stride = (__value->pointer).stride;
        local_50._20_4_ = *(undefined4 *)&(__value->pointer).field_0x14;
        local_50.data = (__value->pointer).data;
        std::
        insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
        ::operator=(&local_90,(value_type *)local_80);
        std::__cxx11::string::~string((string *)(local_80 + 8));
        auVar3 = std::__cxx11::string::~string((string *)&local_b8);
      }
    }
    else {
      piVar1 = std::
               insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
               ::operator=(&local_90,__value);
      auVar3._8_8_ = extraout_RDX;
      auVar3._0_8_ = piVar1;
    }
    _Var2._M_current = auVar3._8_8_;
    in_RAX = auVar3._0_8_;
  }
  iVar4.iter._M_current = _Var2._M_current;
  iVar4.container = in_RAX;
  return iVar4;
}

Assistant:

static OutputIter namedBindingsToProgramLocations (const glw::Functions& gl, deUint32 program, InputIter first, InputIter end, OutputIter out)
{
	for (InputIter cur = first; cur != end; ++cur)
	{
		const BindingPoint& binding = cur->binding;
		if (binding.type == BindingPoint::TYPE_NAME)
		{
			DE_ASSERT(binding.location >= 0);
			int location = gl.getAttribLocation(program, binding.name.c_str());
			if (location >= 0)
			{
				// Add binding.location as an offset to accommodate matrices.
				*out = VertexArrayBinding(BindingPoint(location + binding.location), cur->pointer);
				++out;
			}
		}
		else
		{
			*out = *cur;
			++out;
		}
	}

	return out;
}